

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_string_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required)

{
  flatbuffers_uoffset_t end;
  flatbuffers_uoffset_t offset;
  void *buf;
  int iVar1;
  uint base_00;
  int iVar2;
  flatbuffers_uoffset_t base;
  
  iVar1 = get_offset_field(td,id,required,&base);
  if (base != 0 && iVar1 == 0) {
    buf = td->buf;
    end = td->end;
    offset = *(flatbuffers_uoffset_t *)((long)buf + (ulong)base);
    iVar1 = verify_vector(buf,end,base,offset,4,4,0x3fffffff);
    if (iVar1 == 0) {
      base_00 = offset + base;
      iVar2 = *(int *)((long)buf + (ulong)(offset + base)) + 1;
      do {
        base_00 = base_00 + 4;
        iVar2 = iVar2 + -1;
        if (iVar2 == 0) {
          return 0;
        }
        iVar1 = verify_string(buf,end,base_00,*(flatbuffers_uoffset_t *)((long)buf + (ulong)base_00)
                             );
      } while (iVar1 == 0);
    }
  }
  return iVar1;
}

Assistant:

int flatcc_verify_string_vector_field(flatcc_table_verifier_descriptor_t *td,
    voffset_t id, int required)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_string_vector(td->buf, td->end, base, read_uoffset(td->buf, base));
}